

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phyr_mem.h
# Opt level: O1

void __thiscall phyr::MemoryPool::reset(MemoryPool *this)

{
  size_t *psVar1;
  _List_node_base *p_Var2;
  
  this->curBlockOffset = 0;
  p_Var2 = (this->usedBlocks).
           super__List_base<std::pair<unsigned_char_*,_unsigned_long>,_std::allocator<std::pair<unsigned_char_*,_unsigned_long>_>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  if (p_Var2 != (_List_node_base *)&this->usedBlocks) {
    std::__detail::_List_node_base::_M_transfer
              ((this->freeBlocks).
               super__List_base<std::pair<unsigned_char_*,_unsigned_long>,_std::allocator<std::pair<unsigned_char_*,_unsigned_long>_>_>
               ._M_impl._M_node.super__List_node_base._M_next,p_Var2);
    psVar1 = &(this->freeBlocks).
              super__List_base<std::pair<unsigned_char_*,_unsigned_long>,_std::allocator<std::pair<unsigned_char_*,_unsigned_long>_>_>
              ._M_impl._M_node._M_size;
    *psVar1 = *psVar1 + (this->usedBlocks).
                        super__List_base<std::pair<unsigned_char_*,_unsigned_long>,_std::allocator<std::pair<unsigned_char_*,_unsigned_long>_>_>
                        ._M_impl._M_node._M_size;
    (this->usedBlocks).
    super__List_base<std::pair<unsigned_char_*,_unsigned_long>,_std::allocator<std::pair<unsigned_char_*,_unsigned_long>_>_>
    ._M_impl._M_node._M_size = 0;
  }
  return;
}

Assistant:

void reset() {
        // Don't stash, current block can be reused
        curBlockOffset = 0;
        // Move all used block data to free blocks set
        freeBlocks.splice(freeBlocks.begin(), usedBlocks);
    }